

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Function.cpp
# Opt level: O0

ostream * psy::C::operator<<(ostream *os,FunctionType *funcTy)

{
  bool bVar1;
  ostream *os_00;
  Type *ty;
  reference ppTVar2;
  Type **paramTy;
  iterator __end2;
  iterator __begin2;
  vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *__range2;
  FunctionType *funcTy_local;
  ostream *os_local;
  
  if (funcTy == (FunctionType *)0x0) {
    os_local = std::operator<<(os,"<FunctionType is null>");
  }
  else {
    std::operator<<(os,"<FunctionType | ");
    os_00 = std::operator<<(os," return-type:");
    ty = FunctionType::returnType(funcTy);
    operator<<(os_00,ty);
    FunctionType::parameterTypes
              ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&__begin2,
               funcTy);
    __end2 = std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::begin
                       ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)
                        &__begin2);
    paramTy = (Type **)std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::end
                                 ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                                   *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_psy::C::Type_**,_std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>_>
                                  *)&paramTy);
      if (!bVar1) break;
      ppTVar2 = __gnu_cxx::
                __normal_iterator<const_psy::C::Type_**,_std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>_>
                ::operator*(&__end2);
      std::operator<<(os," parameter-type:");
      operator<<(os,*ppTVar2);
      __gnu_cxx::
      __normal_iterator<const_psy::C::Type_**,_std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::~vector
              ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&__begin2);
    std::operator<<(os,">");
    os_local = os;
  }
  return os_local;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const FunctionType* funcTy)
{
    if (!funcTy)
        return os << "<FunctionType is null>";
    os << "<FunctionType | ";
    os << " return-type:" << funcTy->returnType();
    for (const auto& paramTy : funcTy->parameterTypes()) {
        os << " parameter-type:";
        os << paramTy;
    }
    os << ">";
    return os;
}